

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::UpdateFaceEdges
          (MutableS2ShapeIndex *this,int face,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *face_edges,InteriorTracker *tracker)

{
  int iVar1;
  pointer pFVar2;
  ulong uVar3;
  ulong uVar4;
  S2CellId id;
  S2PaddedCell *pSVar5;
  S2PaddedCell *pSVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  clipped_edges;
  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  clipped_edge_storage;
  EdgeAllocator alloc;
  S2PaddedCell pcell;
  R2Rect bound;
  S2PaddedCell local_90;
  
  bVar9 = 0;
  uVar3 = ((long)(face_edges->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(face_edges->
                super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x60;
  iVar7 = (int)uVar3;
  if ((iVar7 == 0) &&
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    return;
  }
  clipped_edge_storage.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clipped_edge_storage.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clipped_edge_storage.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clipped_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clipped_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clipped_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>::
  reserve(&clipped_edge_storage,(long)iVar7);
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::reserve(&clipped_edges,(long)iVar7);
  R2Rect::Empty();
  lVar8 = 0;
  uVar4 = 0;
  if (0 < iVar7) {
    uVar4 = uVar3 & 0xffffffff;
  }
  for (; uVar4 * 0x60 - lVar8 != 0; lVar8 = lVar8 + 0x60) {
    pcell.padding_ = 1.0;
    pcell.bound_.bounds_[0].bounds_.c_[0] = 0.0;
    pcell.bound_.bounds_[0].bounds_.c_[1] = 1.0;
    pcell.bound_.bounds_[1].bounds_.c_[0] = 0.0;
    pFVar2 = (face_edges->
             super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcell.id_.id_ = (long)&((FaceEdge *)(&pFVar2->a + -1))->shape_id + lVar8;
    R2Rect::FromPointPair
              ((R2Rect *)&local_90,(R2Point *)((long)(pFVar2->a).c_ + lVar8),
               (R2Point *)((long)(pFVar2->b).c_ + lVar8));
    pcell.bound_.bounds_[0].bounds_.c_[1] = local_90.bound_.bounds_[0].bounds_.c_[0];
    pcell.bound_.bounds_[1].bounds_.c_[0] = local_90.bound_.bounds_[0].bounds_.c_[1];
    pcell.padding_ = (double)local_90.id_.id_;
    pcell.bound_.bounds_[0].bounds_.c_[0] = local_90.padding_;
    std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
    ::push_back(&clipped_edge_storage,(value_type *)&pcell);
    local_90.id_.id_ =
         (uint64)(clipped_edge_storage.
                  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::
    vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
    ::emplace_back<MutableS2ShapeIndex::ClippedEdge_const*>
              ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                *)&clipped_edges,(ClippedEdge **)&local_90);
    R2Rect::AddRect(&bound,(R2Rect *)&pcell.padding_);
  }
  alloc.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  alloc.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  alloc.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  alloc.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  alloc.size_ = 0;
  alloc.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  alloc.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (ulong)(uint)face << 0x3d;
  S2PaddedCell::S2PaddedCell(&pcell,(S2CellId)(uVar3 | 0x1000000000000000),kCellPadding);
  iVar1 = this->pending_additions_begin_;
  if ((iVar7 < 1) || (id = ShrinkToFit(this,&pcell,&bound), id.id_ == pcell.id_.id_)) {
    UpdateEdges(this,&pcell,&clipped_edges,tracker,&alloc,iVar1 == 0);
  }
  else {
    uVar4 = ~id.id_ & id.id_ - 1;
    SkipCellRange(this,(S2CellId)(uVar3 | 1),(S2CellId)(id.id_ - uVar4),tracker,&alloc,iVar1 == 0);
    S2PaddedCell::S2PaddedCell(&local_90,id,kCellPadding);
    pSVar5 = &local_90;
    pSVar6 = &pcell;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pSVar6->id_).id_ = (pSVar5->id_).id_;
      pSVar5 = (S2PaddedCell *)((long)pSVar5 + ((ulong)bVar9 * -2 + 1) * 8);
      pSVar6 = (S2PaddedCell *)((long)pSVar6 + (ulong)bVar9 * -0x10 + 8);
    }
    UpdateEdges(this,&pcell,&clipped_edges,tracker,&alloc,iVar1 == 0);
    uVar4 = uVar4 + id.id_;
    SkipCellRange(this,(S2CellId)(uVar4 + (-uVar4 & uVar4) * 2),
                  (S2CellId)(uVar3 + 0x2000000000000001),tracker,&alloc,iVar1 == 0);
  }
  EdgeAllocator::~EdgeAllocator(&alloc);
  std::
  _Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::~_Vector_base(&clipped_edges.
                   super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 );
  std::
  _Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ::~_Vector_base(&clipped_edge_storage.
                   super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                 );
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateFaceEdges(int face,
                                          const vector<FaceEdge>& face_edges,
                                          InteriorTracker* tracker) {
  int num_edges = face_edges.size();
  if (num_edges == 0 && tracker->shape_ids().empty()) return;

  // Create the initial ClippedEdge for each FaceEdge.  Additional clipped
  // edges are created when edges are split between child cells.  We create
  // two arrays, one containing the edge data and another containing pointers
  // to those edges, so that during the recursion we only need to copy
  // pointers in order to propagate an edge to the correct child.
  vector<ClippedEdge> clipped_edge_storage;
  vector<const ClippedEdge*> clipped_edges;
  clipped_edge_storage.reserve(num_edges);
  clipped_edges.reserve(num_edges);
  R2Rect bound = R2Rect::Empty();
  for (int e = 0; e < num_edges; ++e) {
    ClippedEdge clipped;
    clipped.face_edge = &face_edges[e];
    clipped.bound = R2Rect::FromPointPair(face_edges[e].a, face_edges[e].b);
    clipped_edge_storage.push_back(clipped);
    clipped_edges.push_back(&clipped_edge_storage.back());
    bound.AddRect(clipped.bound);
  }
  // Construct the initial face cell containing all the edges, and then update
  // all the edges in the index recursively.
  EdgeAllocator alloc;
  S2CellId face_id = S2CellId::FromFace(face);
  S2PaddedCell pcell(face_id, kCellPadding);

  // "disjoint_from_index" means that the current cell being processed (and
  // all its descendants) are not already present in the index.
  bool disjoint_from_index = is_first_update();
  if (num_edges > 0) {
    S2CellId shrunk_id = ShrinkToFit(pcell, bound);
    if (shrunk_id != pcell.id()) {
      // All the edges are contained by some descendant of the face cell.  We
      // can save a lot of work by starting directly with that cell, but if we
      // are in the interior of at least one shape then we need to create
      // index entries for the cells we are skipping over.
      SkipCellRange(face_id.range_min(), shrunk_id.range_min(),
                    tracker, &alloc, disjoint_from_index);
      pcell = S2PaddedCell(shrunk_id, kCellPadding);
      UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
      SkipCellRange(shrunk_id.range_max().next(), face_id.range_max().next(),
                    tracker, &alloc, disjoint_from_index);
      return;
    }
  }
  // Otherwise (no edges, or no shrinking is possible), subdivide normally.
  UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
}